

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_gesture.cpp
# Opt level: O0

int Am_Gesture_Set_Old_Owner_To_Me_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Wrapper *value;
  Am_Object local_58;
  Am_Value_List local_50 [2];
  undefined1 local_30 [8];
  Am_Value_List items;
  Am_Object cmd;
  int ret;
  Am_Object *self_local;
  
  Am_Object::Am_Object((Am_Object *)&items.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_30);
  pAVar3 = Am_Object::Get(self,0xc5,0);
  Am_Object::operator=((Am_Object *)&items.item,pAVar3);
  bVar1 = Am_Object::Valid((Am_Object *)&items.item);
  if (bVar1) {
    value = Am_Object::operator_cast_to_Am_Wrapper_(self);
    Am_Object::Set((Am_Object *)&items.item,0x170,value,1);
  }
  pAVar3 = Am_Object::Get(self,0xa2,0);
  Am_Value_List::operator=((Am_Value_List *)local_30,pAVar3);
  Am_Value_List::Am_Value_List(local_50,(Am_Value_List *)local_30);
  Am_Object::Am_Object(&local_58,self);
  iVar2 = set_items_list_old_owner(local_50,&local_58);
  Am_Object::~Am_Object(&local_58);
  Am_Value_List::~Am_Value_List(local_50);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_30);
  Am_Object::~Am_Object((Am_Object *)&items.item);
  return iVar2;
}

Assistant:

Am_Define_Formula(int, Am_Gesture_Set_Old_Owner_To_Me)
{
  int ret = 0;
  Am_Object cmd;
  Am_Value_List items;
  cmd = self.Get(Am_COMMAND);
  if (cmd.Valid()) {
    cmd.Set(Am_SAVED_OLD_OWNER, self, Am_OK_IF_NOT_THERE);
    ret = 1;
  }
  items = self.Get(Am_ITEMS);
  ret = set_items_list_old_owner(items, self);

  //ret not used, different values just for debugging
  return ret;
}